

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O0

void readExtra(File *f,int exLen,int *uid,int *gid,int64_t *compSize,int64_t *uncompSize)

{
  uint uVar1;
  allocator aStack_10061;
  string asStack_10060 [8];
  string link;
  undefined2 uStack_10037;
  undefined1 auStack_10035 [2];
  Extra extra;
  int64_t *uncompSize_local;
  int64_t *compSize_local;
  int *gid_local;
  int *uid_local;
  int exLen_local;
  File *f_local;
  
  extra.field_2._65527_8_ = uncompSize;
  uid_local._4_4_ = exLen;
  while (0 < uid_local._4_4_) {
    File::Read<unsigned_char>(f,(uchar *)(link.field_2._M_local_buf + 0xd),4);
    File::Read<unsigned_char>(f,(uchar *)&uStack_10037,(ulong)stack0xfffffffffffeffc7);
    uid_local._4_4_ = uid_local._4_4_ - (stack0xfffffffffffeffc7 + 4);
    if (link.field_2._13_2_ == 0x7875) {
      *uid = _auStack_10035;
      *gid = extra._3_4_;
    }
    else if (link.field_2._13_2_ == 1) {
      if (compSize != (int64_t *)0x0) {
        *compSize = CONCAT53(extra.field_2.zip64.uncompSize._3_5_,extra.field_2.unix.Atime._0_3_);
      }
      if (extra.field_2._65527_8_ != 0) {
        *(ulong *)extra.field_2._65527_8_ =
             CONCAT17(extra.size._1_1_,
                      CONCAT16((undefined1)extra.size,CONCAT42(_auStack_10035,uStack_10037)));
      }
    }
    else if (link.field_2._13_2_ == 0xd) {
      uVar1 = (uint)stack0xfffffffffffeffc7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (asStack_10060,(char *)((long)&extra.field_2.unix2.UID + 2),(long)(int)(uVar1 - 0xc)
                 ,&aStack_10061);
      std::allocator<char>::~allocator((allocator<char> *)&aStack_10061);
      std::__cxx11::string::~string(asStack_10060);
    }
  }
  return;
}

Assistant:

static void readExtra(File& f, int exLen, int* uid, int* gid,
                      int64_t* compSize = nullptr,
                      int64_t* uncompSize = nullptr)
{
    Extra extra;
    while (exLen > 0) {
        f.Read((uint8_t*)&extra, 4);
        f.Read(extra.data, extra.size);
        exLen -= (extra.size + 4);
        // printf("EXTRA %x\n", extra.id);
        if (extra.id == 0x7875) {

            *uid = extra.unix2.UID;
            *gid = extra.unix2.GID;
        } else if (extra.id == 0x01) {
            if (compSize)
                *compSize = extra.zip64.compSize;
            if (uncompSize)
                *uncompSize = extra.zip64.uncompSize;
        } else if (extra.id == 0xd) {
            std::string link((char*)extra.unix.var, extra.size - 12);
            // printf("LINK:%s\n", link.c_str());
        }
    }
}